

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIff.c
# Opt level: O3

Iff_Man_t * Gia_ManIffStart(Gia_Man_t *pGia)

{
  int iVar1;
  Iff_Man_t *pIVar2;
  Vec_Flt_t *pVVar3;
  float *__s;
  Vec_Int_t *pVVar4;
  int *piVar5;
  int iVar6;
  size_t __n;
  long lVar7;
  
  pIVar2 = (Iff_Man_t *)calloc(1,0x40);
  iVar1 = pGia->nObjs;
  pVVar3 = (Vec_Flt_t *)malloc(0x10);
  iVar6 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar6 = iVar1;
  }
  pVVar3->nCap = iVar6;
  lVar7 = (long)iVar6;
  if (iVar6 == 0) {
    __s = (float *)0x0;
  }
  else {
    __s = (float *)malloc(lVar7 * 4);
  }
  pVVar3->pArray = __s;
  pVVar3->nSize = iVar1;
  __n = (long)iVar1 << 2;
  memset(__s,0xff,__n);
  pIVar2->vTimes = pVVar3;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nCap = iVar6;
  if (iVar6 == 0) {
    piVar5 = (int *)0x0;
  }
  else {
    piVar5 = (int *)malloc(lVar7 * 4);
  }
  pVVar4->pArray = piVar5;
  pVVar4->nSize = iVar1;
  memset(piVar5,0xff,__n);
  pIVar2->vMatch[2] = pVVar4;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nCap = iVar6;
  if (iVar6 == 0) {
    piVar5 = (int *)0x0;
  }
  else {
    piVar5 = (int *)malloc(lVar7 << 2);
  }
  pVVar4->pArray = piVar5;
  pVVar4->nSize = iVar1;
  memset(piVar5,0xff,__n);
  pIVar2->vMatch[3] = pVVar4;
  return pIVar2;
}

Assistant:

Iff_Man_t * Gia_ManIffStart( Gia_Man_t * pGia )
{
    Iff_Man_t * p = ABC_CALLOC( Iff_Man_t, 1 );
    p->vTimes    = Vec_FltStartFull( Gia_ManObjNum(pGia) );
    p->vMatch[2] = Vec_IntStartFull( Gia_ManObjNum(pGia) );
    p->vMatch[3] = Vec_IntStartFull( Gia_ManObjNum(pGia) );
    return p;
}